

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.cpp
# Opt level: O0

void __thiscall Person::set_age(Person *this,size_t age)

{
  any local_68 [2];
  allocator<char> local_41;
  string local_40;
  lock_guard<std::recursive_mutex> local_20;
  lock_guard<std::recursive_mutex> lock;
  size_t age_local;
  Person *this_local;
  
  lock._M_device = (mutex_type *)age;
  std::lock_guard<std::recursive_mutex>::lock_guard(&local_20,&this->m_mtx);
  if (lock._M_device != (mutex_type *)this->m_age) {
    this->m_age = (size_t)lock._M_device;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"age",&local_41);
    std::any::any<unsigned_long&,unsigned_long,std::any::_Manager_internal<unsigned_long>,void>
              (local_68,(unsigned_long *)&lock);
    notify(this,&local_40,local_68);
    std::any::~any(local_68);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void set_age(size_t age)
	{
		std::lock_guard<decltype(m_mtx)> lock(m_mtx);

		if(age != m_age)
		{
			m_age = age;
			notify("age", age);
		}
	}